

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O2

FT_Error tt_var_load_item_variation_store(TT_Face face,FT_ULong offset,GX_ItemVarStore itemStore)

{
  FT_Stream stream;
  FT_Memory memory;
  GX_Blend pGVar1;
  FT_Byte FVar2;
  FT_UInt16 FVar3;
  FT_UInt16 FVar4;
  FT_UInt32 FVar5;
  FT_Pointer P;
  GX_VarRegion pGVar6;
  GX_AxisCoords pGVar7;
  GX_ItemVarData pGVar8;
  undefined6 extraout_var;
  FT_UInt *pFVar9;
  FT_ItemVarDelta *pFVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  FT_Fixed *pFVar14;
  bool bVar15;
  FT_Error error;
  uint local_74;
  GX_ItemVarData local_70;
  ulong local_68;
  GX_ItemVarStore local_60;
  ulong local_58;
  ulong local_50;
  uint local_44;
  ulong local_40;
  ulong local_38;
  
  stream = (face->root).stream;
  memory = stream->memory;
  pGVar1 = face->blend;
  error = FT_Stream_Seek(stream,offset);
  if ((error == 0) && (FVar3 = FT_Stream_ReadUShort(stream,&error), error == 0)) {
    if (FVar3 == 1) {
      FVar5 = FT_Stream_ReadULong(stream,&error);
      if (error == 0) {
        local_70 = (GX_ItemVarData)CONCAT44(local_70._4_4_,FVar5);
        FVar3 = FT_Stream_ReadUShort(stream,&error);
        if (error == 0) {
          if (FVar3 != 0) {
            local_40 = (ulong)(uint)FVar3;
            local_68 = CONCAT44(local_68._4_4_,(uint)FVar3);
            P = ft_mem_qrealloc(memory,8,0,local_40,(void *)0x0,&error);
            if (error == 0) {
              local_70 = (GX_ItemVarData)((ulong)local_70 & 0xffffffff);
              uVar13 = 0;
              local_60 = itemStore;
              do {
                if (local_40 == uVar13) {
                  error = FT_Stream_Seek(stream,(long)&local_70->itemCount + offset);
                  if (((error == 0) && (FVar3 = FT_Stream_ReadUShort(stream,&error), error == 0)) &&
                     (FVar4 = FT_Stream_ReadUShort(stream,&error), error == 0)) {
                    local_50 = (ulong)FVar3;
                    if ((pGVar1->mmvar->num_axis != (uint)FVar3) ||
                       (local_60->axisCount = FVar3, (short)FVar4 < 0)) goto LAB_0021642c;
                    uVar13 = (ulong)FVar4;
                    pGVar6 = (GX_VarRegion)ft_mem_realloc(memory,8,0,uVar13,(void *)0x0,&error);
                    local_60->varRegionList = pGVar6;
                    if (error == 0) {
                      local_60->regionCount = (uint)FVar4;
                      local_58 = 0;
                      goto LAB_00216057;
                    }
                  }
                  break;
                }
                FVar5 = FT_Stream_ReadULong(stream,&error);
                *(ulong *)((long)P + uVar13 * 8) = (ulong)FVar5;
                uVar13 = uVar13 + 1;
              } while (error == 0);
            }
            goto LAB_00215f92;
          }
          goto LAB_00215f88;
        }
      }
    }
    else {
LAB_00215f88:
      error = 8;
    }
  }
  P = (void *)0x0;
  goto LAB_00215f92;
LAB_00216057:
  if (uVar13 <= local_58) goto LAB_00216148;
  pGVar7 = (GX_AxisCoords)ft_mem_realloc(memory,0x18,0,local_50,(void *)0x0,&error);
  local_60->varRegionList[local_58].axisList = pGVar7;
  if (error != 0) goto LAB_00215f92;
  pFVar14 = &pGVar7->endCoord;
  for (local_70 = (GX_ItemVarData)0x0; local_70 < (GX_ItemVarData)(ulong)local_60->axisCount;
      local_70 = (GX_ItemVarData)((long)&local_70->itemCount + 1)) {
    FVar3 = FT_Stream_ReadUShort(stream,&error);
    local_74 = CONCAT22(local_74._2_2_,FVar3);
    if (((error != 0) || (FVar3 = FT_Stream_ReadUShort(stream,&error), error != 0)) ||
       (FVar4 = FT_Stream_ReadUShort(stream,&error), error != 0)) goto LAB_00215f92;
    ((GX_AxisCoordsRec_ *)(pFVar14 + -2))->startCoord = (long)(short)local_74 << 2;
    pFVar14[-1] = (long)(short)FVar3 << 2;
    *pFVar14 = (long)(short)FVar4 << 2;
    pFVar14 = pFVar14 + 3;
  }
  local_58 = local_58 + 1;
  uVar13 = (ulong)local_60->regionCount;
  goto LAB_00216057;
LAB_0021642c:
  error = 8;
  goto LAB_00215f92;
LAB_00216148:
  pGVar8 = (GX_ItemVarData)ft_mem_realloc(memory,0x18,0,local_40,(void *)0x0,&error);
  local_60->varData = pGVar8;
  if (error == 0) {
    local_60->dataCount = (FT_UInt)local_68;
    for (local_50 = 0; local_50 != local_40; local_50 = local_50 + 1) {
      local_70 = local_60->varData + local_50;
      error = FT_Stream_Seek(stream,*(long *)((long)P + local_50 * 8) + offset);
      if ((error != 0) || (FVar3 = FT_Stream_ReadUShort(stream,&error), error != 0)) break;
      FVar4 = FT_Stream_ReadUShort(stream,&error);
      local_58 = CONCAT44(local_58._4_4_,(int)CONCAT62(extraout_var,FVar4));
      if ((error != 0) || (FVar4 = FT_Stream_ReadUShort(stream,&error), error != 0)) break;
      local_44 = (uint)local_58 & 0x7fff;
      if ((FVar4 < (ushort)local_44) || (local_74 = (uint)FVar4, local_60->regionCount < local_74))
      goto LAB_0021642c;
      pFVar9 = (FT_UInt *)ft_mem_realloc(memory,4,0,(ulong)local_74,(void *)0x0,&error);
      local_70->regionIndices = pFVar9;
      if (error != 0) break;
      local_70->regionIdxCount = local_74;
      uVar13 = 0;
      while (uVar13 < local_70->regionIdxCount) {
        FVar4 = FT_Stream_ReadUShort(stream,&error);
        local_70->regionIndices[uVar13] = (uint)FVar4;
        if (error != 0) goto LAB_00215f92;
        uVar13 = uVar13 + 1;
        if (local_60->regionCount < (uint)FVar4 || local_60->regionCount == (uint)FVar4)
        goto LAB_0021642c;
      }
      local_38 = (ulong)(local_74 * FVar3);
      pFVar10 = (FT_ItemVarDelta *)ft_mem_realloc(memory,4,0,local_38,(void *)0x0,&error);
      local_70->deltaSet = pFVar10;
      if (error != 0) break;
      local_70->itemCount = (uint)FVar3;
      local_74 = local_74 - local_44;
      local_68 = 0;
      while ((uint)local_68 < (uint)local_38) {
        uVar11 = local_44;
        if ((short)local_58 < 0) {
          while (bVar15 = uVar11 != 0, uVar11 = uVar11 - 1, bVar15) {
            FVar5 = FT_Stream_ReadULong(stream,&error);
            local_70->deltaSet[local_68 & 0xffffffff] = FVar5;
            if (error != 0) goto LAB_00215f92;
            local_68 = (ulong)((int)local_68 + 1);
          }
          for (uVar11 = 0; uVar12 = (int)local_68 + uVar11, local_74 != uVar11; uVar11 = uVar11 + 1)
          {
            FVar3 = FT_Stream_ReadUShort(stream,&error);
            local_70->deltaSet[uVar12] = (int)(short)FVar3;
            if (error != 0) goto LAB_00215f92;
          }
        }
        else {
          while (bVar15 = uVar11 != 0, uVar11 = uVar11 - 1, bVar15) {
            FVar3 = FT_Stream_ReadUShort(stream,&error);
            local_70->deltaSet[local_68 & 0xffffffff] = (int)(short)FVar3;
            if (error != 0) goto LAB_00215f92;
            local_68 = (ulong)((int)local_68 + 1);
          }
          for (uVar11 = 0; uVar12 = (int)local_68 + uVar11, local_74 != uVar11; uVar11 = uVar11 + 1)
          {
            FVar2 = FT_Stream_ReadByte(stream,&error);
            local_70->deltaSet[uVar12] = (int)(char)FVar2;
            if (error != 0) goto LAB_00215f92;
          }
        }
        local_68 = (ulong)uVar12;
      }
    }
  }
LAB_00215f92:
  ft_mem_free(memory,P);
  return error;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_var_load_item_variation_store( TT_Face          face,
                                    FT_ULong         offset,
                                    GX_ItemVarStore  itemStore )
  {
    FT_Stream  stream = FT_FACE_STREAM( face );
    FT_Memory  memory = stream->memory;

    FT_Error   error;
    FT_UShort  format;
    FT_ULong   region_offset;

    FT_UInt    data_count;
    FT_UShort  axis_count;
    FT_UInt    region_count;

    FT_UInt  i, j, k;
    FT_Bool  long_words;

    GX_Blend   blend           = face->blend;
    FT_ULong*  dataOffsetArray = NULL;


    if ( FT_STREAM_SEEK( offset ) ||
         FT_READ_USHORT( format ) )
      goto Exit;

    if ( format != 1 )
    {
      FT_TRACE2(( "tt_var_load_item_variation_store: bad store format %d\n",
                  format ));
      error = FT_THROW( Invalid_Table );
      goto Exit;
    }

    /* read top level fields */
    if ( FT_READ_ULONG( region_offset ) ||
         FT_READ_USHORT( data_count )   )
      goto Exit;

    /* we need at least one entry in `itemStore->varData' */
    if ( !data_count )
    {
      FT_TRACE2(( "tt_var_load_item_variation_store: missing varData\n" ));
      error = FT_THROW( Invalid_Table );
      goto Exit;
    }

    /* make temporary copy of item variation data offsets; */
    /* we will parse region list first, then come back     */
    if ( FT_QNEW_ARRAY( dataOffsetArray, data_count ) )
      goto Exit;

    for ( i = 0; i < data_count; i++ )
    {
      if ( FT_READ_ULONG( dataOffsetArray[i] ) )
        goto Exit;
    }

    /* parse array of region records (region list) */
    if ( FT_STREAM_SEEK( offset + region_offset ) )
      goto Exit;

    if ( FT_READ_USHORT( axis_count )   ||
         FT_READ_USHORT( region_count ) )
      goto Exit;

    if ( axis_count != (FT_Long)blend->mmvar->num_axis )
    {
      FT_TRACE2(( "tt_var_load_item_variation_store:"
                  " number of axes in item variation store\n" ));
      FT_TRACE2(( "                                 "
                  " and `fvar' table are different\n" ));
      error = FT_THROW( Invalid_Table );
      goto Exit;
    }
    itemStore->axisCount = axis_count;

    /* new constraint in OpenType 1.8.4 */
    if ( region_count >= 32768U )
    {
      FT_TRACE2(( "tt_var_load_item_variation_store:"
                  " too many variation region tables\n" ));
      error = FT_THROW( Invalid_Table );
      goto Exit;
    }

    if ( FT_NEW_ARRAY( itemStore->varRegionList, region_count ) )
      goto Exit;
    itemStore->regionCount = region_count;

    for ( i = 0; i < itemStore->regionCount; i++ )
    {
      GX_AxisCoords  axisCoords;


      if ( FT_NEW_ARRAY( itemStore->varRegionList[i].axisList, axis_count ) )
        goto Exit;

      axisCoords = itemStore->varRegionList[i].axisList;

      for ( j = 0; j < itemStore->axisCount; j++ )
      {
        FT_Short  start, peak, end;


        if ( FT_READ_SHORT( start ) ||
             FT_READ_SHORT( peak )  ||
             FT_READ_SHORT( end )   )
          goto Exit;

        axisCoords[j].startCoord = FT_fdot14ToFixed( start );
        axisCoords[j].peakCoord  = FT_fdot14ToFixed( peak );
        axisCoords[j].endCoord   = FT_fdot14ToFixed( end );
      }
    }

    /* end of region list parse */

    /* use dataOffsetArray now to parse varData items */
    if ( FT_NEW_ARRAY( itemStore->varData, data_count ) )
      goto Exit;
    itemStore->dataCount = data_count;

    for ( i = 0; i < data_count; i++ )
    {
      GX_ItemVarData  varData = &itemStore->varData[i];

      FT_UInt  item_count;
      FT_UInt  word_delta_count;
      FT_UInt  region_idx_count;


      if ( FT_STREAM_SEEK( offset + dataOffsetArray[i] ) )
        goto Exit;

      if ( FT_READ_USHORT( item_count )       ||
           FT_READ_USHORT( word_delta_count ) ||
           FT_READ_USHORT( region_idx_count ) )
        goto Exit;

      long_words        = !!( word_delta_count & 0x8000 );
      word_delta_count &= 0x7FFF;

      /* check some data consistency */
      if ( word_delta_count > region_idx_count )
      {
        FT_TRACE2(( "bad short count %d or region count %d\n",
                    word_delta_count,
                    region_idx_count ));
        error = FT_THROW( Invalid_Table );
        goto Exit;
      }

      if ( region_idx_count > itemStore->regionCount )
      {
        FT_TRACE2(( "inconsistent regionCount %d in varData[%d]\n",
                    region_idx_count,
                    i ));
        error = FT_THROW( Invalid_Table );
        goto Exit;
      }

      /* parse region indices */
      if ( FT_NEW_ARRAY( varData->regionIndices, region_idx_count ) )
        goto Exit;
      varData->regionIdxCount = region_idx_count;

      for ( j = 0; j < varData->regionIdxCount; j++ )
      {
        if ( FT_READ_USHORT( varData->regionIndices[j] ) )
          goto Exit;

        if ( varData->regionIndices[j] >= itemStore->regionCount )
        {
          FT_TRACE2(( "bad region index %d\n",
                      varData->regionIndices[j] ));
          error = FT_THROW( Invalid_Table );
          goto Exit;
        }
      }

      /* Parse delta set.                                                  */
      /*                                                                   */
      /* On input, deltas are (word_delta_count + region_idx_count) bytes  */
      /* each if `long_words` isn't set, and twice as much otherwise.      */
      /*                                                                   */
      /* On output, deltas are expanded to `region_idx_count` shorts each. */
      if ( FT_NEW_ARRAY( varData->deltaSet, item_count * region_idx_count ) )
        goto Exit;
      varData->itemCount = item_count;

      for ( j = 0; j < item_count * region_idx_count; )
      {
        if ( long_words )
        {
          for ( k = 0; k < word_delta_count; k++, j++ )
            if ( FT_READ_LONG( varData->deltaSet[j] ) )
              goto Exit;
          for ( ; k < region_idx_count; k++, j++ )
            if ( FT_READ_SHORT( varData->deltaSet[j] ) )
              goto Exit;
        }
        else
        {
          for ( k = 0; k < word_delta_count; k++, j++ )
            if ( FT_READ_SHORT( varData->deltaSet[j] ) )
              goto Exit;
          for ( ; k < region_idx_count; k++, j++ )
            if ( FT_READ_CHAR( varData->deltaSet[j] ) )
              goto Exit;
        }
      }
    }

  Exit:
    FT_FREE( dataOffsetArray );

    return error;
  }